

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EhFrame.cpp
# Opt level: O0

BYTE * EmitLEB128(BYTE *pc,int value)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  byte local_17;
  uint local_14;
  bool signBit;
  BYTE b;
  bool more;
  bool signExtend;
  int value_local;
  BYTE *pc_local;
  
  bVar1 = true;
  local_14 = value;
  _signBit = pc;
  while (bVar1) {
    local_17 = (byte)local_14 & 0x7f;
    uVar2 = (int)local_14 >> 7;
    bVar3 = (local_14 & 0x40) != 0;
    if (((uVar2 == 0) && (!bVar3)) || ((uVar2 == 0xffffffff && (bVar3)))) {
      bVar1 = false;
    }
    else {
      local_17 = local_17 | 0x80;
    }
    *_signBit = local_17;
    local_14 = uVar2;
    _signBit = _signBit + 1;
  }
  return _signBit;
}

Assistant:

BYTE* EmitLEB128(BYTE* pc, int value)
{
    static const int size = sizeof(value) * 8;
    static const bool isLogicShift = (-1 >> 1) != -1;

    const bool signExtend = isLogicShift && value < 0;

    bool more = true;
    while (more)
    {
        BYTE b = value & 0x7F; // low order 7 bits
        value >>= 7;

        if (signExtend)
        {
            value |= - (1 << (size - 7)); // sign extend
        }

        const bool signBit = (b & 0x40) != 0;
        if ((value == 0 && !signBit) || (value == -1 && signBit))
        {
            more = false;
        }
        else
        {
            b |= 0x80;
        }

        *pc++ = b;
    }

    return pc;
}